

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O2

MultiIndexSet * __thiscall
TasGrid::GridLocalPolynomial::getRefinementCanidates<(TasGrid::RuleLocal::erule)4>
          (MultiIndexSet *__return_storage_ptr__,GridLocalPolynomial *this,double tolerance,
          TypeRefinement criteria,int output,vector<int,_std::allocator<int>_> *level_limits,
          double *scale_correction)

{
  MultiIndexSet *exclude;
  uint uVar1;
  pointer piVar2;
  bool bVar3;
  long lVar4;
  long lVar5;
  int i;
  ulong uVar6;
  int i_1;
  ulong uVar7;
  long lVar8;
  Data2D<int> refined;
  Data2D<int> pmap;
  Data2D<int> local_80;
  Data2D<int> local_58;
  
  buildUpdateMap<(TasGrid::RuleLocal::erule)4>
            (&local_58,this,tolerance,criteria,output,scale_correction);
  uVar7 = 0;
  Data2D<int>::Data2D<int,int>(&local_80,(this->super_BaseCanonicalGrid).num_dimensions,0);
  exclude = &(this->super_BaseCanonicalGrid).points;
  uVar1 = (this->super_BaseCanonicalGrid).points.cache_num_indexes;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  if ((level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (level_limits->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    lVar4 = 0;
    for (uVar6 = 0;
        piVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar6 != uVar7; uVar6 = uVar6 + 1) {
      lVar8 = local_58.stride * lVar4;
      for (lVar5 = 0; lVar5 < (this->super_BaseCanonicalGrid).num_dimensions; lVar5 = lVar5 + 1) {
        if (*(int *)((long)piVar2 + lVar5 * 4 + lVar8) == 1) {
          if ((criteria & ~refine_direction_selective) == refine_parents_first) {
            bVar3 = addParent<(TasGrid::RuleLocal::erule)4>
                              (this,(this->super_BaseCanonicalGrid).points.indexes.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,
                               (int)lVar5,exclude,&local_80);
            if (bVar3) goto LAB_00195eba;
          }
          addChild<(TasGrid::RuleLocal::erule)4>
                    (this,(this->super_BaseCanonicalGrid).points.indexes.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,(int)lVar5,
                     exclude,&local_80);
        }
LAB_00195eba:
      }
      lVar4 = lVar4 + 4;
    }
  }
  else {
    lVar4 = 0;
    for (uVar6 = 0;
        piVar2 = local_58.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start, uVar6 != uVar7; uVar6 = uVar6 + 1) {
      lVar8 = local_58.stride * lVar4;
      for (lVar5 = 0; lVar5 < (this->super_BaseCanonicalGrid).num_dimensions; lVar5 = lVar5 + 1) {
        if (*(int *)((long)piVar2 + lVar5 * 4 + lVar8) == 1) {
          if ((criteria & ~refine_direction_selective) == refine_parents_first) {
            bVar3 = addParent<(TasGrid::RuleLocal::erule)4>
                              (this,(this->super_BaseCanonicalGrid).points.indexes.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start +
                                    (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,
                               (int)lVar5,exclude,&local_80);
            if (bVar3) goto LAB_00195e1e;
          }
          addChildLimited<(TasGrid::RuleLocal::erule)4>
                    (this,(this->super_BaseCanonicalGrid).points.indexes.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start +
                          (this->super_BaseCanonicalGrid).points.num_dimensions * uVar6,(int)lVar5,
                     exclude,level_limits,&local_80);
        }
LAB_00195e1e:
      }
      lVar4 = lVar4 + 4;
    }
  }
  MultiIndexSet::MultiIndexSet(__return_storage_ptr__,&local_80);
  if (criteria == refine_stable) {
    HierarchyManipulations::completeToLower<(TasGrid::RuleLocal::erule)4>
              (exclude,__return_storage_ptr__);
  }
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_80.vec.super__Vector_base<int,_std::allocator<int>_>);
  ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&local_58.vec.super__Vector_base<int,_std::allocator<int>_>);
  return __return_storage_ptr__;
}

Assistant:

MultiIndexSet GridLocalPolynomial::getRefinementCanidates(double tolerance, TypeRefinement criteria, int output, const std::vector<int> &level_limits, const double *scale_correction) const{
    Data2D<int> pmap = buildUpdateMap<effrule>(tolerance, criteria, output, scale_correction);

    bool useParents = (criteria == refine_fds) || (criteria == refine_parents_first);

    Data2D<int> refined(num_dimensions, 0);

    int num_points = points.getNumIndexes();

    #ifdef _OPENMP
    #pragma omp parallel
    {
        Data2D<int> lrefined(num_dimensions, 0);

        if (level_limits.empty()){
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChild<effrule>(points.getIndex(i), j, points, lrefined);
                        }
                    }
                }
            }
        }else{
            #pragma omp for
            for(int i=0; i<num_points; i++){
                const int *map = pmap.getStrip(i);
                for(int j=0; j<num_dimensions; j++){
                    if (map[j] == 1){ // if this dimension needs to be refined
                        if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, lrefined))){
                            addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, lrefined);
                        }
                    }
                }
            }
        }

        #pragma omp critical
        {
            refined.append(lrefined);
        }
    }
    #else
    if (level_limits.empty()){
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChild<effrule>(points.getIndex(i), j, points, refined);
                    }
                }
            }
        }
    }else{
        for(int i=0; i<num_points; i++){
            const int *map = pmap.getStrip(i);
            for(int j=0; j<num_dimensions; j++){
                if (map[j] == 1){ // if this dimension needs to be refined
                    if (!(useParents && addParent<effrule>(points.getIndex(i), j, points, refined))){
                        addChildLimited<effrule>(points.getIndex(i), j, points, level_limits, refined);
                    }
                }
            }
        }
    }
    #endif

    MultiIndexSet result(refined);
    if (criteria == refine_stable)
        HierarchyManipulations::completeToLower<effrule>(points, result);

    return result;
}